

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Edge.cpp
# Opt level: O0

void __thiscall Edge::show(Edge *this)

{
  uint uVar1;
  uint uVar2;
  Edge *this_local;
  
  uVar1 = Vertex::getID(this->origin);
  uVar2 = Vertex::getID(this->destiny);
  printf("[ ( %d, %d ) A{%d} chave = %d  modif = %d res = %.5f  reat = %.5f  fA = %.5f  fR = %.5f  peA = %.9f  peR = %.9f ]"
         ,this->resistance,this->reactance,this->activePowerFlow,this->reactivePowerFlow,
         this->activeLoss,this->reactiveLoss,(ulong)uVar1,(ulong)uVar2,(ulong)(uint)this->id,
         (ulong)(this->closed & 1),(ulong)(this->modifiable & 1));
  return;
}

Assistant:

void Edge::show(){
    printf("[ ( %d, %d ) A{%d} chave = %d  modif = %d res = %.5f  reat = %.5f  fA = %.5f  fR = %.5f  peA = %.9f  peR = %.9f ]",
    this->origin->getID(), this->destiny->getID(), this->id, this->closed, this->modifiable, this->resistance, this->reactance,
    this->activePowerFlow, this->reactivePowerFlow, this->activeLoss, this->reactiveLoss);
}